

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirENCODING(void)

{
  int iVar1;
  char *local_30;
  char *aP;
  string arg;
  
  GetDelimitedString_abi_cxx11_((string *)&aP,&lp);
  local_30 = (char *)std::__cxx11::string::data();
  iVar1 = cmphstr(&local_30,"dos",false);
  if (iVar1 == 0) {
    iVar1 = cmphstr(&local_30,"win",false);
    if (iVar1 == 0) {
      Error("[ENCODING] Invalid argument (valid values: \"dos\" and \"win\")",local_30,IF_FIRST);
    }
    else {
      ConvertEncoding = 1;
    }
  }
  else {
    ConvertEncoding = 0;
  }
  std::__cxx11::string::~string((string *)&aP);
  return;
}

Assistant:

static void dirENCODING() {
	auto arg = GetDelimitedString(lp);
	char* aP = arg.data();
	if (cmphstr(aP, "dos")) {
		ConvertEncoding = ENCDOS;
	} else if (cmphstr(aP, "win")) {
		ConvertEncoding = ENCWIN;
	} else {
		Error("[ENCODING] Invalid argument (valid values: \"dos\" and \"win\")", aP, IF_FIRST);
	}
}